

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct32_stage5_sse4_1
               (__m128i *bf1,__m128i *cospim16,__m128i *cospi48,__m128i *cospi16,__m128i *cospim48,
               __m128i *clamp_lo,__m128i *clamp_hi,__m128i *rounding,int bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  alVar1 = bf1[10];
  alVar2 = bf1[0xd];
  auVar17 = pmulld((undefined1  [16])*cospim16,(undefined1  [16])bf1[9]);
  auVar27 = pmulld((undefined1  [16])bf1[0xe],(undefined1  [16])*cospi48);
  iVar3 = (int)(*rounding)[0];
  iVar5 = *(int *)((long)*rounding + 4);
  iVar7 = (int)(*rounding)[1];
  iVar9 = *(int *)((long)*rounding + 0xc);
  auVar18 = ZEXT416((uint)bit);
  auVar26 = pmulld((undefined1  [16])*cospi48,(undefined1  [16])bf1[9]);
  auVar25 = pmulld((undefined1  [16])bf1[0xe],(undefined1  [16])*cospi16);
  *(int *)bf1[0xe] = auVar26._0_4_ + iVar3 + auVar25._0_4_ >> auVar18;
  *(int *)((long)bf1[0xe] + 4) = auVar26._4_4_ + iVar5 + auVar25._4_4_ >> auVar18;
  *(int *)(bf1[0xe] + 1) = auVar26._8_4_ + iVar7 + auVar25._8_4_ >> auVar18;
  *(int *)((long)bf1[0xe] + 0xc) = auVar26._12_4_ + iVar9 + auVar25._12_4_ >> auVar18;
  *(int *)bf1[9] = auVar27._0_4_ + auVar17._0_4_ + iVar3 >> auVar18;
  *(int *)((long)bf1[9] + 4) = auVar27._4_4_ + auVar17._4_4_ + iVar5 >> auVar18;
  *(int *)(bf1[9] + 1) = auVar27._8_4_ + auVar17._8_4_ + iVar7 >> auVar18;
  *(int *)((long)bf1[9] + 0xc) = auVar27._12_4_ + auVar17._12_4_ + iVar9 >> auVar18;
  auVar25 = pmulld((undefined1  [16])*cospim48,(undefined1  [16])alVar1);
  auVar27 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospim16);
  iVar3 = (int)(*rounding)[0];
  iVar5 = *(int *)((long)*rounding + 4);
  iVar7 = (int)(*rounding)[1];
  iVar9 = *(int *)((long)*rounding + 0xc);
  auVar26 = pmulld((undefined1  [16])*cospim16,(undefined1  [16])alVar1);
  auVar17 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospi48);
  *(int *)bf1[0xd] = auVar26._0_4_ + iVar3 + auVar17._0_4_ >> auVar18;
  *(int *)((long)bf1[0xd] + 4) = auVar26._4_4_ + iVar5 + auVar17._4_4_ >> auVar18;
  *(int *)(bf1[0xd] + 1) = auVar26._8_4_ + iVar7 + auVar17._8_4_ >> auVar18;
  *(int *)((long)bf1[0xd] + 0xc) = auVar26._12_4_ + iVar9 + auVar17._12_4_ >> auVar18;
  *(int *)bf1[10] = auVar27._0_4_ + auVar25._0_4_ + iVar3 >> auVar18;
  *(int *)((long)bf1[10] + 4) = auVar27._4_4_ + auVar25._4_4_ + iVar5 >> auVar18;
  *(int *)(bf1[10] + 1) = auVar27._8_4_ + auVar25._8_4_ + iVar7 >> auVar18;
  *(int *)((long)bf1[10] + 0xc) = auVar27._12_4_ + auVar25._12_4_ + iVar9 >> auVar18;
  iVar3 = (int)bf1[0x10][0];
  iVar5 = *(int *)((long)bf1[0x10] + 4);
  iVar7 = (int)bf1[0x10][1];
  iVar9 = *(int *)((long)bf1[0x10] + 0xc);
  iVar11 = (int)bf1[0x13][0];
  iVar12 = *(int *)((long)bf1[0x13] + 4);
  iVar13 = (int)bf1[0x13][1];
  iVar14 = *(int *)((long)bf1[0x13] + 0xc);
  iVar15 = iVar11 + iVar3;
  iVar19 = iVar12 + iVar5;
  iVar21 = iVar13 + iVar7;
  iVar23 = iVar14 + iVar9;
  iVar3 = iVar3 - iVar11;
  iVar5 = iVar5 - iVar12;
  iVar7 = iVar7 - iVar13;
  iVar9 = iVar9 - iVar14;
  iVar11 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar13 = (int)(*clamp_lo)[1];
  iVar14 = *(int *)((long)*clamp_lo + 0xc);
  uVar16 = (uint)(iVar15 < iVar11) * iVar11 | (uint)(iVar15 >= iVar11) * iVar15;
  uVar20 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar22 = (uint)(iVar21 < iVar13) * iVar13 | (uint)(iVar21 >= iVar13) * iVar21;
  uVar24 = (uint)(iVar23 < iVar14) * iVar14 | (uint)(iVar23 >= iVar14) * iVar23;
  iVar15 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar21 = (int)(*clamp_hi)[1];
  iVar23 = *(int *)((long)*clamp_hi + 0xc);
  uVar4 = (uint)(iVar3 < iVar11) * iVar11 | (uint)(iVar3 >= iVar11) * iVar3;
  uVar6 = (uint)(iVar5 < iVar12) * iVar12 | (uint)(iVar5 >= iVar12) * iVar5;
  uVar8 = (uint)(iVar7 < iVar13) * iVar13 | (uint)(iVar7 >= iVar13) * iVar7;
  uVar10 = (uint)(iVar9 < iVar14) * iVar14 | (uint)(iVar9 >= iVar14) * iVar9;
  *(uint *)bf1[0x10] = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)((long)bf1[0x10] + 4) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)(bf1[0x10] + 1) =
       (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0x10] + 0xc) =
       (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)bf1[0x13] = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
  *(uint *)((long)bf1[0x13] + 4) =
       (uint)(iVar19 < (int)uVar6) * iVar19 | (iVar19 >= (int)uVar6) * uVar6;
  *(uint *)(bf1[0x13] + 1) = (uint)(iVar21 < (int)uVar8) * iVar21 | (iVar21 >= (int)uVar8) * uVar8;
  *(uint *)((long)bf1[0x13] + 0xc) =
       (uint)(iVar23 < (int)uVar10) * iVar23 | (iVar23 >= (int)uVar10) * uVar10;
  iVar3 = (int)bf1[0x11][0];
  iVar5 = *(int *)((long)bf1[0x11] + 4);
  iVar7 = (int)bf1[0x11][1];
  iVar9 = *(int *)((long)bf1[0x11] + 0xc);
  iVar11 = (int)bf1[0x12][0];
  iVar12 = *(int *)((long)bf1[0x12] + 4);
  iVar13 = (int)bf1[0x12][1];
  iVar14 = *(int *)((long)bf1[0x12] + 0xc);
  iVar15 = iVar11 + iVar3;
  iVar19 = iVar12 + iVar5;
  iVar21 = iVar13 + iVar7;
  iVar23 = iVar14 + iVar9;
  iVar3 = iVar3 - iVar11;
  iVar5 = iVar5 - iVar12;
  iVar7 = iVar7 - iVar13;
  iVar9 = iVar9 - iVar14;
  iVar11 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar13 = (int)(*clamp_lo)[1];
  iVar14 = *(int *)((long)*clamp_lo + 0xc);
  uVar16 = (uint)(iVar15 < iVar11) * iVar11 | (uint)(iVar15 >= iVar11) * iVar15;
  uVar20 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar22 = (uint)(iVar21 < iVar13) * iVar13 | (uint)(iVar21 >= iVar13) * iVar21;
  uVar24 = (uint)(iVar23 < iVar14) * iVar14 | (uint)(iVar23 >= iVar14) * iVar23;
  iVar15 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar21 = (int)(*clamp_hi)[1];
  iVar23 = *(int *)((long)*clamp_hi + 0xc);
  uVar4 = (uint)(iVar3 < iVar11) * iVar11 | (uint)(iVar3 >= iVar11) * iVar3;
  uVar6 = (uint)(iVar5 < iVar12) * iVar12 | (uint)(iVar5 >= iVar12) * iVar5;
  uVar8 = (uint)(iVar7 < iVar13) * iVar13 | (uint)(iVar7 >= iVar13) * iVar7;
  uVar10 = (uint)(iVar9 < iVar14) * iVar14 | (uint)(iVar9 >= iVar14) * iVar9;
  *(uint *)bf1[0x11] = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)((long)bf1[0x11] + 4) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)(bf1[0x11] + 1) =
       (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0x11] + 0xc) =
       (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)bf1[0x12] = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
  *(uint *)((long)bf1[0x12] + 4) =
       (uint)(iVar19 < (int)uVar6) * iVar19 | (iVar19 >= (int)uVar6) * uVar6;
  *(uint *)(bf1[0x12] + 1) = (uint)(iVar21 < (int)uVar8) * iVar21 | (iVar21 >= (int)uVar8) * uVar8;
  *(uint *)((long)bf1[0x12] + 0xc) =
       (uint)(iVar23 < (int)uVar10) * iVar23 | (iVar23 >= (int)uVar10) * uVar10;
  iVar3 = (int)bf1[0x14][0];
  iVar5 = *(int *)((long)bf1[0x14] + 4);
  iVar7 = (int)bf1[0x14][1];
  iVar9 = *(int *)((long)bf1[0x14] + 0xc);
  iVar11 = (int)bf1[0x17][0];
  iVar12 = *(int *)((long)bf1[0x17] + 4);
  iVar13 = (int)bf1[0x17][1];
  iVar14 = *(int *)((long)bf1[0x17] + 0xc);
  iVar15 = iVar3 + iVar11;
  iVar19 = iVar5 + iVar12;
  iVar21 = iVar7 + iVar13;
  iVar23 = iVar9 + iVar14;
  iVar11 = iVar11 - iVar3;
  iVar12 = iVar12 - iVar5;
  iVar13 = iVar13 - iVar7;
  iVar14 = iVar14 - iVar9;
  iVar3 = (int)(*clamp_lo)[0];
  iVar5 = *(int *)((long)*clamp_lo + 4);
  iVar7 = (int)(*clamp_lo)[1];
  iVar9 = *(int *)((long)*clamp_lo + 0xc);
  uVar16 = (uint)(iVar15 < iVar3) * iVar3 | (uint)(iVar15 >= iVar3) * iVar15;
  uVar20 = (uint)(iVar19 < iVar5) * iVar5 | (uint)(iVar19 >= iVar5) * iVar19;
  uVar22 = (uint)(iVar21 < iVar7) * iVar7 | (uint)(iVar21 >= iVar7) * iVar21;
  uVar24 = (uint)(iVar23 < iVar9) * iVar9 | (uint)(iVar23 >= iVar9) * iVar23;
  iVar15 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar21 = (int)(*clamp_hi)[1];
  iVar23 = *(int *)((long)*clamp_hi + 0xc);
  uVar4 = (uint)(iVar11 < iVar3) * iVar3 | (uint)(iVar11 >= iVar3) * iVar11;
  uVar6 = (uint)(iVar12 < iVar5) * iVar5 | (uint)(iVar12 >= iVar5) * iVar12;
  uVar8 = (uint)(iVar13 < iVar7) * iVar7 | (uint)(iVar13 >= iVar7) * iVar13;
  uVar10 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  *(uint *)bf1[0x17] = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)((long)bf1[0x17] + 4) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)(bf1[0x17] + 1) =
       (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0x17] + 0xc) =
       (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)bf1[0x14] = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
  *(uint *)((long)bf1[0x14] + 4) =
       (uint)(iVar19 < (int)uVar6) * iVar19 | (iVar19 >= (int)uVar6) * uVar6;
  *(uint *)(bf1[0x14] + 1) = (uint)(iVar21 < (int)uVar8) * iVar21 | (iVar21 >= (int)uVar8) * uVar8;
  *(uint *)((long)bf1[0x14] + 0xc) =
       (uint)(iVar23 < (int)uVar10) * iVar23 | (iVar23 >= (int)uVar10) * uVar10;
  iVar3 = (int)bf1[0x15][0];
  iVar5 = *(int *)((long)bf1[0x15] + 4);
  iVar7 = (int)bf1[0x15][1];
  iVar9 = *(int *)((long)bf1[0x15] + 0xc);
  iVar11 = (int)bf1[0x16][0];
  iVar12 = *(int *)((long)bf1[0x16] + 4);
  iVar13 = (int)bf1[0x16][1];
  iVar14 = *(int *)((long)bf1[0x16] + 0xc);
  iVar15 = iVar3 + iVar11;
  iVar19 = iVar5 + iVar12;
  iVar21 = iVar7 + iVar13;
  iVar23 = iVar9 + iVar14;
  iVar11 = iVar11 - iVar3;
  iVar12 = iVar12 - iVar5;
  iVar13 = iVar13 - iVar7;
  iVar14 = iVar14 - iVar9;
  iVar3 = (int)(*clamp_lo)[0];
  iVar5 = *(int *)((long)*clamp_lo + 4);
  iVar7 = (int)(*clamp_lo)[1];
  iVar9 = *(int *)((long)*clamp_lo + 0xc);
  uVar16 = (uint)(iVar15 < iVar3) * iVar3 | (uint)(iVar15 >= iVar3) * iVar15;
  uVar20 = (uint)(iVar19 < iVar5) * iVar5 | (uint)(iVar19 >= iVar5) * iVar19;
  uVar22 = (uint)(iVar21 < iVar7) * iVar7 | (uint)(iVar21 >= iVar7) * iVar21;
  uVar24 = (uint)(iVar23 < iVar9) * iVar9 | (uint)(iVar23 >= iVar9) * iVar23;
  iVar15 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar21 = (int)(*clamp_hi)[1];
  iVar23 = *(int *)((long)*clamp_hi + 0xc);
  uVar4 = (uint)(iVar11 < iVar3) * iVar3 | (uint)(iVar11 >= iVar3) * iVar11;
  uVar6 = (uint)(iVar12 < iVar5) * iVar5 | (uint)(iVar12 >= iVar5) * iVar12;
  uVar8 = (uint)(iVar13 < iVar7) * iVar7 | (uint)(iVar13 >= iVar7) * iVar13;
  uVar10 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  *(uint *)bf1[0x16] = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)((long)bf1[0x16] + 4) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)(bf1[0x16] + 1) =
       (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0x16] + 0xc) =
       (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)bf1[0x15] = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
  *(uint *)((long)bf1[0x15] + 4) =
       (uint)(iVar19 < (int)uVar6) * iVar19 | (iVar19 >= (int)uVar6) * uVar6;
  *(uint *)(bf1[0x15] + 1) = (uint)(iVar21 < (int)uVar8) * iVar21 | (iVar21 >= (int)uVar8) * uVar8;
  *(uint *)((long)bf1[0x15] + 0xc) =
       (uint)(iVar23 < (int)uVar10) * iVar23 | (iVar23 >= (int)uVar10) * uVar10;
  iVar3 = (int)bf1[0x18][0];
  iVar5 = *(int *)((long)bf1[0x18] + 4);
  iVar7 = (int)bf1[0x18][1];
  iVar9 = *(int *)((long)bf1[0x18] + 0xc);
  iVar11 = (int)bf1[0x1b][0];
  iVar12 = *(int *)((long)bf1[0x1b] + 4);
  iVar13 = (int)bf1[0x1b][1];
  iVar14 = *(int *)((long)bf1[0x1b] + 0xc);
  iVar15 = iVar11 + iVar3;
  iVar19 = iVar12 + iVar5;
  iVar21 = iVar13 + iVar7;
  iVar23 = iVar14 + iVar9;
  iVar3 = iVar3 - iVar11;
  iVar5 = iVar5 - iVar12;
  iVar7 = iVar7 - iVar13;
  iVar9 = iVar9 - iVar14;
  iVar11 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar13 = (int)(*clamp_lo)[1];
  iVar14 = *(int *)((long)*clamp_lo + 0xc);
  uVar16 = (uint)(iVar15 < iVar11) * iVar11 | (uint)(iVar15 >= iVar11) * iVar15;
  uVar20 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar22 = (uint)(iVar21 < iVar13) * iVar13 | (uint)(iVar21 >= iVar13) * iVar21;
  uVar24 = (uint)(iVar23 < iVar14) * iVar14 | (uint)(iVar23 >= iVar14) * iVar23;
  iVar15 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar21 = (int)(*clamp_hi)[1];
  iVar23 = *(int *)((long)*clamp_hi + 0xc);
  uVar4 = (uint)(iVar3 < iVar11) * iVar11 | (uint)(iVar3 >= iVar11) * iVar3;
  uVar6 = (uint)(iVar5 < iVar12) * iVar12 | (uint)(iVar5 >= iVar12) * iVar5;
  uVar8 = (uint)(iVar7 < iVar13) * iVar13 | (uint)(iVar7 >= iVar13) * iVar7;
  uVar10 = (uint)(iVar9 < iVar14) * iVar14 | (uint)(iVar9 >= iVar14) * iVar9;
  *(uint *)bf1[0x18] = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)((long)bf1[0x18] + 4) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)(bf1[0x18] + 1) =
       (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0x18] + 0xc) =
       (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)bf1[0x1b] = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
  *(uint *)((long)bf1[0x1b] + 4) =
       (uint)(iVar19 < (int)uVar6) * iVar19 | (iVar19 >= (int)uVar6) * uVar6;
  *(uint *)(bf1[0x1b] + 1) = (uint)(iVar21 < (int)uVar8) * iVar21 | (iVar21 >= (int)uVar8) * uVar8;
  *(uint *)((long)bf1[0x1b] + 0xc) =
       (uint)(iVar23 < (int)uVar10) * iVar23 | (iVar23 >= (int)uVar10) * uVar10;
  iVar3 = (int)bf1[0x19][0];
  iVar5 = *(int *)((long)bf1[0x19] + 4);
  iVar7 = (int)bf1[0x19][1];
  iVar9 = *(int *)((long)bf1[0x19] + 0xc);
  iVar11 = (int)bf1[0x1a][0];
  iVar12 = *(int *)((long)bf1[0x1a] + 4);
  iVar13 = (int)bf1[0x1a][1];
  iVar14 = *(int *)((long)bf1[0x1a] + 0xc);
  iVar15 = iVar11 + iVar3;
  iVar19 = iVar12 + iVar5;
  iVar21 = iVar13 + iVar7;
  iVar23 = iVar14 + iVar9;
  iVar3 = iVar3 - iVar11;
  iVar5 = iVar5 - iVar12;
  iVar7 = iVar7 - iVar13;
  iVar9 = iVar9 - iVar14;
  iVar11 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar13 = (int)(*clamp_lo)[1];
  iVar14 = *(int *)((long)*clamp_lo + 0xc);
  uVar16 = (uint)(iVar15 < iVar11) * iVar11 | (uint)(iVar15 >= iVar11) * iVar15;
  uVar20 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar22 = (uint)(iVar21 < iVar13) * iVar13 | (uint)(iVar21 >= iVar13) * iVar21;
  uVar24 = (uint)(iVar23 < iVar14) * iVar14 | (uint)(iVar23 >= iVar14) * iVar23;
  iVar15 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar21 = (int)(*clamp_hi)[1];
  iVar23 = *(int *)((long)*clamp_hi + 0xc);
  uVar4 = (uint)(iVar3 < iVar11) * iVar11 | (uint)(iVar3 >= iVar11) * iVar3;
  uVar6 = (uint)(iVar5 < iVar12) * iVar12 | (uint)(iVar5 >= iVar12) * iVar5;
  uVar8 = (uint)(iVar7 < iVar13) * iVar13 | (uint)(iVar7 >= iVar13) * iVar7;
  uVar10 = (uint)(iVar9 < iVar14) * iVar14 | (uint)(iVar9 >= iVar14) * iVar9;
  *(uint *)bf1[0x19] = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)((long)bf1[0x19] + 4) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)(bf1[0x19] + 1) =
       (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0x19] + 0xc) =
       (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)bf1[0x1a] = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
  *(uint *)((long)bf1[0x1a] + 4) =
       (uint)(iVar19 < (int)uVar6) * iVar19 | (iVar19 >= (int)uVar6) * uVar6;
  *(uint *)(bf1[0x1a] + 1) = (uint)(iVar21 < (int)uVar8) * iVar21 | (iVar21 >= (int)uVar8) * uVar8;
  *(uint *)((long)bf1[0x1a] + 0xc) =
       (uint)(iVar23 < (int)uVar10) * iVar23 | (iVar23 >= (int)uVar10) * uVar10;
  iVar3 = (int)bf1[0x1c][0];
  iVar5 = *(int *)((long)bf1[0x1c] + 4);
  iVar7 = (int)bf1[0x1c][1];
  iVar9 = *(int *)((long)bf1[0x1c] + 0xc);
  iVar11 = (int)bf1[0x1f][0];
  iVar12 = *(int *)((long)bf1[0x1f] + 4);
  iVar13 = (int)bf1[0x1f][1];
  iVar14 = *(int *)((long)bf1[0x1f] + 0xc);
  iVar15 = iVar3 + iVar11;
  iVar19 = iVar5 + iVar12;
  iVar21 = iVar7 + iVar13;
  iVar23 = iVar9 + iVar14;
  iVar11 = iVar11 - iVar3;
  iVar12 = iVar12 - iVar5;
  iVar13 = iVar13 - iVar7;
  iVar14 = iVar14 - iVar9;
  iVar3 = (int)(*clamp_lo)[0];
  iVar5 = *(int *)((long)*clamp_lo + 4);
  iVar7 = (int)(*clamp_lo)[1];
  iVar9 = *(int *)((long)*clamp_lo + 0xc);
  uVar16 = (uint)(iVar15 < iVar3) * iVar3 | (uint)(iVar15 >= iVar3) * iVar15;
  uVar20 = (uint)(iVar19 < iVar5) * iVar5 | (uint)(iVar19 >= iVar5) * iVar19;
  uVar22 = (uint)(iVar21 < iVar7) * iVar7 | (uint)(iVar21 >= iVar7) * iVar21;
  uVar24 = (uint)(iVar23 < iVar9) * iVar9 | (uint)(iVar23 >= iVar9) * iVar23;
  iVar15 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar21 = (int)(*clamp_hi)[1];
  iVar23 = *(int *)((long)*clamp_hi + 0xc);
  uVar4 = (uint)(iVar11 < iVar3) * iVar3 | (uint)(iVar11 >= iVar3) * iVar11;
  uVar6 = (uint)(iVar12 < iVar5) * iVar5 | (uint)(iVar12 >= iVar5) * iVar12;
  uVar8 = (uint)(iVar13 < iVar7) * iVar7 | (uint)(iVar13 >= iVar7) * iVar13;
  uVar10 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  *(uint *)bf1[0x1f] = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)((long)bf1[0x1f] + 4) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)(bf1[0x1f] + 1) =
       (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0x1f] + 0xc) =
       (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)bf1[0x1c] = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
  *(uint *)((long)bf1[0x1c] + 4) =
       (uint)(iVar19 < (int)uVar6) * iVar19 | (iVar19 >= (int)uVar6) * uVar6;
  *(uint *)(bf1[0x1c] + 1) = (uint)(iVar21 < (int)uVar8) * iVar21 | (iVar21 >= (int)uVar8) * uVar8;
  *(uint *)((long)bf1[0x1c] + 0xc) =
       (uint)(iVar23 < (int)uVar10) * iVar23 | (iVar23 >= (int)uVar10) * uVar10;
  iVar3 = (int)bf1[0x1d][0];
  iVar5 = *(int *)((long)bf1[0x1d] + 4);
  iVar7 = (int)bf1[0x1d][1];
  iVar9 = *(int *)((long)bf1[0x1d] + 0xc);
  iVar11 = (int)bf1[0x1e][0];
  iVar12 = *(int *)((long)bf1[0x1e] + 4);
  iVar13 = (int)bf1[0x1e][1];
  iVar14 = *(int *)((long)bf1[0x1e] + 0xc);
  iVar15 = iVar3 + iVar11;
  iVar19 = iVar5 + iVar12;
  iVar21 = iVar7 + iVar13;
  iVar23 = iVar9 + iVar14;
  iVar11 = iVar11 - iVar3;
  iVar12 = iVar12 - iVar5;
  iVar13 = iVar13 - iVar7;
  iVar14 = iVar14 - iVar9;
  iVar3 = (int)(*clamp_lo)[0];
  iVar5 = *(int *)((long)*clamp_lo + 4);
  iVar7 = (int)(*clamp_lo)[1];
  iVar9 = *(int *)((long)*clamp_lo + 0xc);
  uVar16 = (uint)(iVar15 < iVar3) * iVar3 | (uint)(iVar15 >= iVar3) * iVar15;
  uVar20 = (uint)(iVar19 < iVar5) * iVar5 | (uint)(iVar19 >= iVar5) * iVar19;
  uVar22 = (uint)(iVar21 < iVar7) * iVar7 | (uint)(iVar21 >= iVar7) * iVar21;
  uVar24 = (uint)(iVar23 < iVar9) * iVar9 | (uint)(iVar23 >= iVar9) * iVar23;
  iVar15 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar21 = (int)(*clamp_hi)[1];
  iVar23 = *(int *)((long)*clamp_hi + 0xc);
  uVar4 = (uint)(iVar11 < iVar3) * iVar3 | (uint)(iVar11 >= iVar3) * iVar11;
  uVar6 = (uint)(iVar12 < iVar5) * iVar5 | (uint)(iVar12 >= iVar5) * iVar12;
  uVar8 = (uint)(iVar13 < iVar7) * iVar7 | (uint)(iVar13 >= iVar7) * iVar13;
  uVar10 = (uint)(iVar14 < iVar9) * iVar9 | (uint)(iVar14 >= iVar9) * iVar14;
  *(uint *)bf1[0x1e] = (uint)(iVar15 < (int)uVar16) * iVar15 | (iVar15 >= (int)uVar16) * uVar16;
  *(uint *)((long)bf1[0x1e] + 4) =
       (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
  *(uint *)(bf1[0x1e] + 1) =
       (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
  *(uint *)((long)bf1[0x1e] + 0xc) =
       (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
  *(uint *)bf1[0x1d] = (uint)(iVar15 < (int)uVar4) * iVar15 | (iVar15 >= (int)uVar4) * uVar4;
  *(uint *)((long)bf1[0x1d] + 4) =
       (uint)(iVar19 < (int)uVar6) * iVar19 | (iVar19 >= (int)uVar6) * uVar6;
  *(uint *)(bf1[0x1d] + 1) = (uint)(iVar21 < (int)uVar8) * iVar21 | (iVar21 >= (int)uVar8) * uVar8;
  *(uint *)((long)bf1[0x1d] + 0xc) =
       (uint)(iVar23 < (int)uVar10) * iVar23 | (iVar23 >= (int)uVar10) * uVar10;
  return;
}

Assistant:

static inline void idct32_stage5_sse4_1(
    __m128i *bf1, const __m128i *cospim16, const __m128i *cospi48,
    const __m128i *cospi16, const __m128i *cospim48, const __m128i *clamp_lo,
    const __m128i *clamp_hi, const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  temp1 = half_btf_sse4_1(cospim16, &bf1[9], cospi48, &bf1[14], rounding, bit);
  bf1[14] = half_btf_sse4_1(cospi48, &bf1[9], cospi16, &bf1[14], rounding, bit);
  bf1[9] = temp1;

  temp2 =
      half_btf_sse4_1(cospim48, &bf1[10], cospim16, &bf1[13], rounding, bit);
  bf1[13] =
      half_btf_sse4_1(cospim16, &bf1[10], cospi48, &bf1[13], rounding, bit);
  bf1[10] = temp2;

  addsub_sse4_1(bf1[16], bf1[19], bf1 + 16, bf1 + 19, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[17], bf1[18], bf1 + 17, bf1 + 18, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[23], bf1[20], bf1 + 23, bf1 + 20, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[22], bf1[21], bf1 + 22, bf1 + 21, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[24], bf1[27], bf1 + 24, bf1 + 27, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[25], bf1[26], bf1 + 25, bf1 + 26, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[31], bf1[28], bf1 + 31, bf1 + 28, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[30], bf1[29], bf1 + 30, bf1 + 29, clamp_lo, clamp_hi);
}